

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_e1e9c::readWriteTest(string *tempDir,int channelCount,int testTimes)

{
  uint uVar1;
  ostream *poVar2;
  bool bVar3;
  string filename;
  string local_70;
  string local_50;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,channelCount);
  poVar2 = std::operator<<(poVar2," channels ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,testTimes);
  poVar2 = std::operator<<(poVar2," times.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  std::operator+(&filename,tempDir,"imf_test_deep_scanline_basic.exr");
  uVar1 = 0;
  if (testTimes < 1) {
    testTimes = 0;
  }
  while( true ) {
    bVar3 = testTimes == 0;
    testTimes = testTimes + -1;
    if (bVar3) break;
    std::__cxx11::string::string((string *)&local_50,(string *)&filename);
    generateRandomFile(&local_50,channelCount,uVar1 % 3,false);
    std::__cxx11::string::~string((string *)&local_50);
    readFile(&filename,channelCount,false,false);
    if (1 < channelCount) {
      readFile(&filename,channelCount,false,true);
    }
    remove(filename._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    std::__cxx11::string::string((string *)&local_70,(string *)&filename);
    generateRandomFile(&local_70,channelCount,uVar1 % 3,true);
    std::__cxx11::string::~string((string *)&local_70);
    readFile(&filename,channelCount,true,false);
    if (1 < channelCount) {
      readFile(&filename,channelCount,true,true);
    }
    remove(filename._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    uVar1 = uVar1 + 1;
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void readWriteTest(const std::string & tempDir, int channelCount, int testTimes)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes << " times."
         << endl << flush;

    std::string filename = tempDir + "imf_test_deep_scanline_basic.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0:
                compression = NO_COMPRESSION;
                break;
            case 1:
                compression = RLE_COMPRESSION;
                break;
            case 2:
                compression = ZIPS_COMPRESSION;
                break;
        }

        generateRandomFile (filename, channelCount, compression, false);
        readFile (filename, channelCount, false , false );
	if (channelCount>1)
	    readFile (filename, channelCount, false , true );
        remove (filename.c_str());
        cout << endl << flush;

        generateRandomFile (filename, channelCount, compression, true);
        readFile (filename, channelCount, true , false );
	if (channelCount>1)
	    readFile (filename, channelCount, true , true );
        remove (filename.c_str());
        cout << endl << flush;
    }
}